

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O1

HighsDebugStatus __thiscall HSimplexNla::debugCheckData(HSimplexNla *this,string *message)

{
  HighsInt *pHVar1;
  HighsInt *pHVar2;
  double *pdVar3;
  HighsLp *pHVar4;
  HighsInt *pHVar5;
  HighsInt *pHVar6;
  double *pdVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  HighsDebugStatus HVar11;
  ulong uVar12;
  string scale_status;
  HighsLp check_lp;
  
  scale_status._M_dataplus._M_p = (pointer)&scale_status.field_2;
  scale_status._M_string_length = 0;
  scale_status.field_2._M_local_buf[0] = '\0';
  pcVar9 = "non-NULL";
  if (this->scale_ == (HighsScale *)0x0) {
    pcVar9 = "NULL";
  }
  std::__cxx11::string::_M_replace((ulong)&scale_status,0,(char *)0x0,(ulong)pcVar9);
  HighsLp::HighsLp(&check_lp,this->lp_);
  pHVar1 = (this->factor_).a_start;
  pHVar2 = (this->factor_).a_index;
  pdVar3 = (this->factor_).a_value;
  if (this->scale_ == (HighsScale *)0x0) {
    pHVar4 = this->lp_;
    pHVar5 = (pHVar4->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar6 = (pHVar4->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar4->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((pHVar1 != pHVar5) || (pHVar2 != pHVar6)) || (pdVar3 != pdVar7)) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                   "CheckNlaData: (%s) scale_ is %s lp_ - factor_ matrix pointer errors\n",
                   (message->_M_dataplus)._M_p,scale_status._M_dataplus._M_p);
      if (pHVar1 != pHVar5) {
        printf("a_matrix_.start_ pointer error: %p vs %p\n",pHVar1,
               (this->lp_->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
      }
      if (pHVar2 != pHVar6) {
        puts("a_matrix_.index pointer error");
      }
      HVar11 = kLogicalError;
      if (pdVar3 != pdVar7) {
        puts("a_matrix_.value pointer error");
      }
      goto LAB_0036aee0;
    }
  }
  else {
    HighsLp::applyScale(&check_lp);
  }
  uVar12 = 0xffffffff;
  if (-1 < check_lp.num_col_) {
    uVar10 = 0;
    do {
      if (check_lp.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] != pHVar1[uVar10]) {
        uVar12 = uVar10 & 0xffffffff;
        break;
      }
      uVar10 = uVar10 + 1;
    } while ((ulong)(uint)check_lp.num_col_ + 1 != uVar10);
  }
  if ((int)uVar12 < 0) {
    uVar8 = HighsSparseMatrix::numNz(&check_lp.a_matrix_);
    uVar12 = 0xffffffff;
    if (0 < (int)uVar8) {
      uVar10 = 0;
      do {
        if (check_lp.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] != pHVar2[uVar10]) {
          uVar12 = uVar10 & 0xffffffff;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    if ((int)uVar12 < 0) {
      if (0 < (int)uVar8) {
        uVar10 = 0;
        do {
          if ((check_lp.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[uVar10] != pdVar3[uVar10]) ||
             (NAN(check_lp.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10]) || NAN(pdVar3[uVar10]))) {
            uVar12 = uVar10 & 0xffffffff;
            break;
          }
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      if ((int)uVar12 < 0) {
        HVar11 = kOk;
      }
      else {
        HVar11 = kLogicalError;
        highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                     "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.value_ != factor_Avalue for el %d (%g != %g)\n"
                     ,check_lp.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12],pdVar3[uVar12],
                     (message->_M_dataplus)._M_p,scale_status._M_dataplus._M_p);
      }
    }
    else {
      HVar11 = kLogicalError;
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                   "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.index_ != factor_Aindex for el %d (%d != %d)\n"
                   ,(message->_M_dataplus)._M_p,scale_status._M_dataplus._M_p,uVar12,
                   (ulong)(uint)check_lp.a_matrix_.index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar12],(ulong)(uint)pHVar2[uVar12]
                  );
    }
  }
  else {
    HVar11 = kLogicalError;
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.start_ != factor_Astart for col %d (%d != %d)\n"
                 ,(message->_M_dataplus)._M_p,scale_status._M_dataplus._M_p,uVar12,
                 (ulong)(uint)check_lp.a_matrix_.start_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar12],(ulong)(uint)pHVar1[uVar12]);
  }
LAB_0036aee0:
  HighsLp::~HighsLp(&check_lp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scale_status._M_dataplus._M_p != &scale_status.field_2) {
    operator_delete(scale_status._M_dataplus._M_p);
  }
  return HVar11;
}

Assistant:

HighsDebugStatus HSimplexNla::debugCheckData(const std::string message) const {
  std::string scale_status;
  if (scale_ == NULL) {
    scale_status = "NULL";
  } else {
    scale_status = "non-NULL";
  }
  //  if (options_->highs_debug_level < kHighsDebugLevelCheap) return
  //  HighsDebugStatus::kOk;
  HighsLp check_lp = *lp_;
  bool error0_found = false;
  bool error1_found = false;
  bool error2_found = false;
  bool error_found = false;
  const HighsInt* factor_Astart = factor_.getAstart();
  const HighsInt* factor_Aindex = factor_.getAindex();
  const double* factor_Avalue = factor_.getAvalue();

  if (scale_ == NULL) {
    if (factor_Astart != lp_->a_matrix_.start_.data()) error0_found = true;
    if (factor_Aindex != lp_->a_matrix_.index_.data()) error1_found = true;
    if (factor_Avalue != lp_->a_matrix_.value_.data()) error2_found = true;
    error_found = error0_found || error1_found || error2_found;
    if (error_found) {
      highsLogUser(options_->log_options, HighsLogType::kError,
                   "CheckNlaData: (%s) scale_ is %s lp_ - factor_ matrix "
                   "pointer errors\n",
                   message.c_str(), scale_status.c_str());
      if (error0_found)
        printf("a_matrix_.start_ pointer error: %p vs %p\n",
               (void*)factor_Astart, (void*)lp_->a_matrix_.start_.data());
      if (error1_found) printf("a_matrix_.index pointer error\n");
      if (error2_found) printf("a_matrix_.value pointer error\n");
      assert(!error_found);
      return HighsDebugStatus::kLogicalError;
    }
  } else {
    check_lp.applyScale();
  }
  HighsInt error_col = -1;
  for (HighsInt iCol = 0; iCol < check_lp.num_col_ + 1; iCol++) {
    if (check_lp.a_matrix_.start_[iCol] != factor_Astart[iCol]) {
      error_col = iCol;
      break;
    }
  }
  error_found = error_col >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.start_ != "
                 "factor_Astart for col %d (%d != %d)\n",
                 message.c_str(), scale_status.c_str(), (int)error_col,
                 (int)check_lp.a_matrix_.start_[error_col],
                 (int)factor_Astart[error_col]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  HighsInt nnz = check_lp.a_matrix_.numNz();
  HighsInt error_el = -1;
  for (HighsInt iEl = 0; iEl < nnz; iEl++) {
    if (check_lp.a_matrix_.index_[iEl] != factor_Aindex[iEl]) {
      error_el = iEl;
      break;
    }
  }
  error_found = error_el >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.index_ != "
                 "factor_Aindex for el %d (%d != %d)\n",
                 message.c_str(), scale_status.c_str(), (int)error_el,
                 (int)check_lp.a_matrix_.index_[error_el],
                 (int)factor_Aindex[error_el]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  for (HighsInt iEl = 0; iEl < nnz; iEl++) {
    if (check_lp.a_matrix_.value_[iEl] != factor_Avalue[iEl]) {
      error_el = iEl;
      break;
    }
  }
  error_found = error_el >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.value_ != "
                 "factor_Avalue for el %d (%g != %g)\n",
                 message.c_str(), scale_status.c_str(), (int)error_el,
                 check_lp.a_matrix_.value_[error_el], factor_Avalue[error_el]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  return HighsDebugStatus::kOk;
}